

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NortekDVL.h
# Opt level: O0

int GetNMEASentenceNortekDVL(NORTEKDVL *pNortekDVL,NMEADATA *pNMEAData)

{
  int iVar1;
  double dVar2;
  int local_10a4;
  undefined1 local_10a0 [8];
  CHRONO chrono;
  char local_104f [2];
  char mnemonic [6];
  char talkerid [3];
  int sentencelen;
  char *ptr;
  int local_1038;
  int nbBytesDiscarded;
  int nbBytesToRequest;
  int res;
  int recvbuflen;
  int BytesReceived;
  char recvbuf [4096];
  NMEADATA *pNMEAData_local;
  NORTEKDVL *pNortekDVL_local;
  
  res = 0;
  nbBytesToRequest = 0;
  nbBytesDiscarded = 1;
  local_1038 = 0;
  ptr._4_4_ = 0;
  stack0xffffffffffffefb8 = (char *)0x0;
  mnemonic[1] = '\0';
  mnemonic[2] = '\0';
  mnemonic[3] = '\0';
  mnemonic[4] = '\0';
  StartChrono((CHRONO *)local_10a0);
  memset(&recvbuflen,0,0x1000);
  nbBytesToRequest = 0xfff;
  res = 0;
  local_1038 = 3;
  iVar1 = ReadAllRS232Port(&pNortekDVL->RS232Port,(uint8 *)&recvbuflen,3);
  if (iVar1 == 0) {
    if ((pNortekDVL->bSaveRawData != 0) && (pNortekDVL->pfSaveFile != (FILE *)0x0)) {
      fwrite(&recvbuflen,(long)local_1038,1,(FILE *)pNortekDVL->pfSaveFile);
      fflush((FILE *)pNortekDVL->pfSaveFile);
    }
    res = local_1038 + res;
    do {
      memset(local_104f,0,3);
      memset((void *)((long)&chrono.Suspended + 3),0,6);
      nbBytesDiscarded =
           FindSentenceNMEA((char *)&recvbuflen,res,local_104f,(char *)((long)&chrono.Suspended + 3)
                            ,(int *)(mnemonic + 1),&local_1038,(char **)(mnemonic + 5),
                            (int *)((long)&ptr + 4));
      if (nbBytesDiscarded == 0) {
        if (0 < (res - ptr._4_4_) - mnemonic._1_4_) {
          printf("Warning getting data from a NortekDVL : Unexpected data after a sentence. \n");
        }
        iVar1 = ProcessSentenceNMEA(stack0xffffffffffffefb8,mnemonic._1_4_,local_104f,
                                    (char *)((long)&chrono.Suspended + 3),pNMEAData);
        if (iVar1 != 0) {
          return 1;
        }
        return 0;
      }
      if (nbBytesDiscarded == 1) {
        if (ptr._4_4_ < 4) {
          local_10a4 = ptr._4_4_;
        }
        else {
          local_10a4 = 3;
        }
        local_1038 = local_10a4;
      }
      memmove(&recvbuflen,(void *)((long)&recvbuflen + (long)ptr._4_4_),(long)(res - ptr._4_4_));
      res = res - ptr._4_4_;
      if (nbBytesToRequest < res + local_1038) {
        printf("Error reading data from a NortekDVL : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadAllRS232Port(&pNortekDVL->RS232Port,(uint8 *)((long)&recvbuflen + (long)res),
                               local_1038);
      if (iVar1 != 0) {
        printf("Error reading data from a NortekDVL. \n");
        return 1;
      }
      if ((pNortekDVL->bSaveRawData != 0) && (pNortekDVL->pfSaveFile != (FILE *)0x0)) {
        fwrite((void *)((long)&recvbuflen + (long)res),(long)local_1038,1,
               (FILE *)pNortekDVL->pfSaveFile);
        fflush((FILE *)pNortekDVL->pfSaveFile);
      }
      res = local_1038 + res;
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_10a0);
    } while (dVar2 <= 4.0);
    printf("Error reading data from a NortekDVL : Sentence timeout. \n");
    pNortekDVL_local._4_4_ = 2;
  }
  else {
    printf("Error reading data from a NortekDVL. \n");
    pNortekDVL_local._4_4_ = 1;
  }
  return pNortekDVL_local._4_4_;
}

Assistant:

inline int GetNMEASentenceNortekDVL(NORTEKDVL* pNortekDVL, NMEADATA* pNMEAData)
{
	char recvbuf[MAX_NB_BYTES_NORTEKDVL];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	char* ptr = NULL;
	int sentencelen = 0;
	char talkerid[MAX_NB_BYTES_TALKER_ID_NMEA+1]; // +1 for the null terminator character for strings.
	char mnemonic[MAX_NB_BYTES_MNEMONIC_NMEA+1]; // +1 for the null terminator character for strings.
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_NORTEKDVL-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_NB_BYTES_SENTENCE_NMEA;
	if (ReadAllRS232Port(&pNortekDVL->RS232Port, (uint8*)recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a NortekDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pNortekDVL->bSaveRawData)&&(pNortekDVL->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, pNortekDVL->pfSaveFile);
		fflush(pNortekDVL->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		memset(talkerid, 0, sizeof(talkerid));
		memset(mnemonic, 0, sizeof(mnemonic));
		res = FindSentenceNMEA(recvbuf, BytesReceived, talkerid, mnemonic, &sentencelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_NB_BYTES_SENTENCE_NMEA, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a NortekDVL : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pNortekDVL->RS232Port, (uint8*)recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a NortekDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pNortekDVL->bSaveRawData)&&(pNortekDVL->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, pNortekDVL->pfSaveFile);
			fflush(pNortekDVL->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NORTEKDVL)
		{
			printf("Error reading data from a NortekDVL : Sentence timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-sentencelen > 0)
	{
		printf("Warning getting data from a NortekDVL : Unexpected data after a sentence. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *psentencelen)
	//{
	//	printf("Error getting data from a NortekDVL : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*psentencelen > 0)
	//{
	//	memcpy(databuf, ptr, *psentencelen);
	//}

	if (ProcessSentenceNMEA(ptr, sentencelen, talkerid, mnemonic, pNMEAData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}